

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O0

void duckdb::IntervalAverageOperation::Finalize<duckdb::interval_t,duckdb::IntervalAvgState>
               (IntervalAvgState *state,interval_t *target,AggregateFinalizeData *finalize_data)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 *in_RSI;
  long *in_RDI;
  AggregateFinalizeData *unaff_retaddr;
  long micros_remainder;
  long days_remainder;
  long months_remainder;
  long count;
  interval_t *value;
  
  if (*in_RDI == 0) {
    AggregateFinalizeData::ReturnNull(unaff_retaddr);
  }
  else {
    lVar3 = UnsafeNumericCast<long,long,void>(*in_RDI);
    *in_RSI = (int)((long)(int)in_RDI[1] / lVar3);
    lVar4 = in_RDI[1];
    in_RSI[1] = (int)((long)*(int *)((long)in_RDI + 0xc) / lVar3);
    iVar1 = *(int *)((long)in_RDI + 0xc);
    *(long *)(in_RSI + 2) = in_RDI[2] / lVar3;
    lVar2 = in_RDI[2];
    lVar4 = ((long)(int)lVar4 % lVar3) * 0x1e;
    in_RSI[1] = in_RSI[1] + (int)(lVar4 / lVar3);
    *(long *)(in_RSI + 2) =
         ((lVar4 % lVar3 + (long)iVar1 % lVar3) * 86400000000) / lVar3 + lVar2 % lVar3 +
         *(long *)(in_RSI + 2);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			// DivideOperator does not borrow fractions right,
			// TODO: Maybe it should?
			// Copy PG implementation.
			const auto &value = state.value;
			const auto count = UnsafeNumericCast<int64_t>(state.count);

			target.months = value.months / count;
			auto months_remainder = value.months % count;

			target.days = value.days / count;
			auto days_remainder = value.days % count;

			target.micros = value.micros / count;
			auto micros_remainder = value.micros % count;

			//	Shift the remainders right
			months_remainder *= Interval::DAYS_PER_MONTH;
			target.days += months_remainder / count;
			days_remainder += months_remainder % count;

			days_remainder *= Interval::MICROS_PER_DAY;
			micros_remainder += days_remainder / count;
			target.micros += micros_remainder;
		}
	}